

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.h
# Opt level: O2

void __thiscall cursespp::ShortcutsWindow::Entry::~Entry(Entry *this)

{
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->key);
  return;
}

Assistant:

Entry(const std::string& key, const std::string& desc, int64_t attrs = -1) {
                    this->key = key;
                    this->description = desc;
                    this->attrs = attrs;
                }